

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O1

iterator * __thiscall LineReader<true>::iterator::operator++(iterator *this)

{
  int iVar1;
  long lVar2;
  string local_38;
  
  iVar1 = feof((FILE *)this->f_->fp_);
  if (iVar1 == 0) {
    lVar2 = ftell((FILE *)this->f_->fp_);
    this->offset_ = lVar2;
    File::readLine_abi_cxx11_(&local_38,this->f_);
    std::__cxx11::string::operator=((string *)&this->line,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this->offset_ = -1;
  }
  return this;
}

Assistant:

iterator& operator++()
        {
            if (f_.atEnd())
                offset_ = -1;
            else {
                offset_ = f_.tell();
                line = f_.readLine();
            }
            return *this;
        }